

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_env_infrastructure_reuse.hpp
# Opt level: O2

disp_binding_activator_t * __thiscall
so_5::env_infrastructures::st_reusable_stuff::
default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>_>
::bind_agent(disp_binding_activator_t *__return_storage_ptr__,
            default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>_>
            *this,environment_t *param_1,agent_ref_t *agent)

{
  atomic<unsigned_long> *paVar1;
  anon_class_16_2_e3bdd2f0 result;
  anon_class_16_2_e3bdd2f0 local_18;
  
  local_18.agent = (agent_ref_t)agent->m_obj;
  if (local_18.agent.m_obj != (agent_t *)0x0) {
    LOCK();
    ((local_18.agent.m_obj)->super_atomic_refcounted_t).m_ref_counter.
    super___atomic_base<unsigned_long>._M_i =
         ((local_18.agent.m_obj)->super_atomic_refcounted_t).m_ref_counter.
         super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  LOCK();
  paVar1 = &((this->m_actual_disp).m_ptr)->m_agents_bound;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_18.this = this;
  std::function<void()>::
  function<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>>::bind_agent(so_5::environment_t&,so_5::intrusive_ptr_t<so_5::agent_t>)::_lambda()_1_,void>
            ((function<void()> *)__return_storage_ptr__,&local_18);
  intrusive_ptr_t<so_5::agent_t>::dismiss_object(&local_18.agent);
  return __return_storage_ptr__;
}

Assistant:

virtual disp_binding_activator_t
		bind_agent(
			environment_t & /*env*/,
			agent_ref_t agent ) override
			{
				auto result = [agent, this]() {
					agent->so_bind_to_dispatcher( m_actual_disp.get().event_queue() );
				};

				// Dispatcher must know about yet another agent bound.
				m_actual_disp.get().agent_bound();

				return result;
			}